

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

Ptr addExpress(TokenReader *tokens)

{
  Token *__r;
  SimpleASTNode *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  invalid_argument *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  undefined1 local_e8 [8];
  Token token;
  string str;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  Ptr child1;
  Ptr child2;
  
  mulExpress((TokenReader *)local_58);
  child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tokens;
  std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
             (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  while( true ) {
    TokenReader::peek();
    if (((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
         _vptr__Sp_counted_base == (_func_int **)0x0) ||
       ((local_e8._0_4_ & ~INT_LITERAL_TYPE) != PLUS_TYPE)) break;
    __r = (Token *)(token.val.field_2._M_local_buf + 8);
    TokenReader::read();
    Token::operator=((Token *)local_e8,__r);
    std::__cxx11::string::~string((string *)&str);
    mulExpress((TokenReader *)
               &child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_78._M_dataplus._M_p._0_4_ = 4;
    std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
              ((ASTNodeType *)__r,&local_78);
    _Var2 = child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,(__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str);
    pSVar1 = (SimpleASTNode *)(_Var2._M_pi)->_vptr__Sp_counted_base;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,(__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    _Var2 = child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::operator+(&local_78,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&token.val.field_2 + 8),&local_78,"\" Light argument is required!");
      std::__cxx11::string::~string((string *)&local_78);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,(char *)token.val.field_2._8_8_);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pSVar1 = (SimpleASTNode *)
             (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             )->_vptr__Sp_counted_base;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_58,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)_Var2._M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
    std::__cxx11::string::~string((string *)&token);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1);
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  return (Ptr)PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr addExpress(TokenReader& tokens)
{
    SimpleASTNode::Ptr child1 = mulExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    while (true) {
        Token token = tokens.peek();
        if (node != nullptr && !token.isEmpty() && (token.type == TokenType::PLUS_TYPE || token.type == TokenType::MINUS_TYPE)) {
            token = tokens.read();
            SimpleASTNode::Ptr child2 = mulExpress(tokens);
            node = SimpleASTNode::create(ASTNodeType::ADDITIVE_EXP, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
            {
                std::string str = "\"" + token.val + "\" Light argument is required!";
                throw std::invalid_argument(str.c_str());
            }
            child1 = node; //key step.
        } else {
            break;
        }
    }
    return node;
}